

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O1

void av1_compute_stats_highbd_c
               (int wiener_win,uint8_t *dgd8,uint8_t *src8,int16_t *dgd_avg,int16_t *src_avg,
               int h_start,int h_end,int v_start,int v_end,int dgd_stride,int src_stride,int64_t *M,
               int64_t *H,aom_bit_depth_t bit_depth)

{
  long lVar1;
  ushort uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  ushort *puVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  int64_t *piVar10;
  int iVar11;
  long lVar12;
  long *plVar13;
  long lVar14;
  ushort *puVar15;
  ushort *puVar16;
  ulong uVar17;
  long lVar18;
  int *piVar19;
  ushort *puVar20;
  ulong uVar21;
  long *plVar22;
  int32_t Y [49];
  long local_158;
  int local_f8 [50];
  
  uVar7 = wiener_win * wiener_win;
  if (v_start < v_end) {
    lVar5 = (long)v_start;
    lVar12 = (long)dgd8 * 2 + dgd_stride * lVar5 * 2;
    uVar21 = 0;
    do {
      lVar14 = (long)h_start;
      if (h_start < h_end) {
        do {
          uVar21 = uVar21 + *(ushort *)(lVar12 + lVar14 * 2);
          lVar14 = lVar14 + 1;
        } while (h_end != lVar14);
      }
      lVar5 = lVar5 + 1;
      lVar12 = lVar12 + (long)dgd_stride * 2;
    } while (lVar5 != v_end);
  }
  else {
    uVar21 = 0;
  }
  lVar12 = 0x10;
  if (bit_depth != AOM_BITS_12) {
    lVar12 = (ulong)(bit_depth == AOM_BITS_10) * 3 + 1;
  }
  uVar8 = (ulong)uVar7;
  memset(M,0,uVar8 * 8);
  memset(H,0,uVar8 * 8 * uVar8);
  if (v_end - v_start != 0 && v_start <= v_end) {
    iVar11 = wiener_win >> 1;
    uVar21 = uVar21 / (ulong)(long)((v_end - v_start) * (h_end - h_start));
    lVar5 = (long)dgd_stride;
    local_158 = (long)v_start;
    puVar20 = (ushort *)
              ((long)dgd8 * 2 +
              (long)h_start * 2 + (local_158 - iVar11) * lVar5 * 2 + (long)iVar11 * -2);
    do {
      if (h_start < h_end) {
        puVar16 = puVar20;
        lVar14 = (long)h_start;
        do {
          if (-1 < iVar11) {
            lVar18 = 0;
            puVar15 = puVar16;
            iVar9 = -iVar11;
            do {
              lVar18 = (long)(int)lVar18;
              puVar6 = puVar15;
              iVar3 = iVar11 * 2 + 1;
              do {
                local_f8[lVar18] = (uint)*puVar6 - (uint)(ushort)uVar21;
                lVar18 = lVar18 + 1;
                puVar6 = puVar6 + lVar5;
                iVar3 = iVar3 + -1;
              } while (iVar3 != 0);
              iVar9 = iVar9 + 1;
              puVar15 = puVar15 + 1;
            } while (iVar11 + 1 != iVar9);
          }
          if (wiener_win != 0) {
            uVar2 = *(ushort *)((long)src8 * 2 + local_158 * src_stride * 2 + lVar14 * 2);
            piVar19 = local_f8;
            uVar4 = 0;
            piVar10 = H;
            do {
              iVar9 = local_f8[uVar4];
              M[uVar4] = M[uVar4] + (long)iVar9 * ((ulong)uVar2 - (uVar21 & 0xffff));
              lVar18 = 0;
              do {
                piVar10[lVar18] = piVar10[lVar18] + (long)piVar19[lVar18] * (long)iVar9;
                lVar1 = uVar4 + lVar18;
                lVar18 = lVar18 + 1;
              } while (lVar1 + 1U < uVar8);
              uVar4 = uVar4 + 1;
              piVar10 = piVar10 + uVar8 + 1;
              piVar19 = piVar19 + 1;
            } while (uVar4 != uVar7 + (uVar7 == 0));
          }
          lVar14 = lVar14 + 1;
          puVar16 = puVar16 + 1;
        } while (lVar14 != h_end);
      }
      local_158 = local_158 + 1;
      puVar20 = puVar20 + lVar5;
    } while (local_158 != v_end);
  }
  if (wiener_win != 0) {
    piVar10 = H + 1;
    plVar13 = H + uVar8;
    uVar4 = 0;
    uVar21 = uVar8;
    do {
      uVar21 = uVar21 - 1;
      M[uVar4] = M[uVar4] / lVar12;
      uVar17 = (ulong)(uVar7 * (int)uVar4);
      H[uVar4 + uVar17] = H[uVar4 + uVar17] / lVar12;
      uVar4 = uVar4 + 1;
      if (uVar4 < uVar8) {
        uVar17 = 0;
        plVar22 = plVar13;
        do {
          lVar5 = piVar10[uVar17];
          piVar10[uVar17] = lVar5 / lVar12;
          *plVar22 = lVar5 / lVar12;
          uVar17 = uVar17 + 1;
          plVar22 = plVar22 + uVar8;
        } while (uVar21 != uVar17);
      }
      piVar10 = piVar10 + uVar8 + 1;
      plVar13 = plVar13 + uVar8 + 1;
    } while (uVar4 != uVar7 + (uVar7 == 0));
  }
  return;
}

Assistant:

void av1_compute_stats_highbd_c(int wiener_win, const uint8_t *dgd8,
                                const uint8_t *src8, int16_t *dgd_avg,
                                int16_t *src_avg, int h_start, int h_end,
                                int v_start, int v_end, int dgd_stride,
                                int src_stride, int64_t *M, int64_t *H,
                                aom_bit_depth_t bit_depth) {
  (void)dgd_avg;
  (void)src_avg;
  int i, j, k, l;
  int32_t Y[WIENER_WIN2];
  const int wiener_win2 = wiener_win * wiener_win;
  const int wiener_halfwin = (wiener_win >> 1);
  const uint16_t *src = CONVERT_TO_SHORTPTR(src8);
  const uint16_t *dgd = CONVERT_TO_SHORTPTR(dgd8);
  uint16_t avg =
      find_average_highbd(dgd, h_start, h_end, v_start, v_end, dgd_stride);

  uint8_t bit_depth_divider = 1;
  if (bit_depth == AOM_BITS_12)
    bit_depth_divider = 16;
  else if (bit_depth == AOM_BITS_10)
    bit_depth_divider = 4;

  memset(M, 0, sizeof(*M) * wiener_win2);
  memset(H, 0, sizeof(*H) * wiener_win2 * wiener_win2);
  for (i = v_start; i < v_end; i++) {
    for (j = h_start; j < h_end; j++) {
      const int32_t X = (int32_t)src[i * src_stride + j] - (int32_t)avg;
      int idx = 0;
      for (k = -wiener_halfwin; k <= wiener_halfwin; k++) {
        for (l = -wiener_halfwin; l <= wiener_halfwin; l++) {
          Y[idx] = (int32_t)dgd[(i + l) * dgd_stride + (j + k)] - (int32_t)avg;
          idx++;
        }
      }
      assert(idx == wiener_win2);
      for (k = 0; k < wiener_win2; ++k) {
        M[k] += (int64_t)Y[k] * X;
        for (l = k; l < wiener_win2; ++l) {
          // H is a symmetric matrix, so we only need to fill out the upper
          // triangle here. We can copy it down to the lower triangle outside
          // the (i, j) loops.
          H[k * wiener_win2 + l] += (int64_t)Y[k] * Y[l];
        }
      }
    }
  }
  for (k = 0; k < wiener_win2; ++k) {
    M[k] /= bit_depth_divider;
    H[k * wiener_win2 + k] /= bit_depth_divider;
    for (l = k + 1; l < wiener_win2; ++l) {
      H[k * wiener_win2 + l] /= bit_depth_divider;
      H[l * wiener_win2 + k] = H[k * wiener_win2 + l];
    }
  }
}